

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::calcBall(Map *this,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Palette *pPVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  Ball *pBVar10;
  long lVar11;
  uint y;
  uint x;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  if (0x1d < (uint)n) goto LAB_001042f4;
  if (this->ball[(uint)n] == (Ball *)0x0) goto LAB_001042f4;
  dVar7 = cos((double)this->ball[(uint)n]->angle * 3.14);
  fVar16 = this->ball[(uint)n]->speed;
  dVar8 = sin((double)this->ball[(uint)n]->angle * 3.14);
  pBVar10 = this->ball[(uint)n];
  fVar14 = (float)(dVar7 * (double)fVar16);
  fVar15 = (float)(dVar8 * (double)pBVar10->speed);
  uVar1 = pBVar10->x;
  uVar2 = pBVar10->y;
  fVar16 = (float)uVar1 + fVar14;
  fVar17 = (float)uVar2 + fVar15;
  pBVar10->x = fVar16;
  pBVar10->y = fVar17;
  if ((fVar16 <= 0.0) || ((float)this->fieldWidth <= fVar16)) {
    fVar12 = pBVar10->angle;
    if (fVar12 <= 0.0) {
      if (fVar12 < 0.0) {
        fVar13 = -1.0;
        goto LAB_00104034;
      }
      fVar13 = -fVar12;
    }
    else {
      fVar13 = 1.0;
LAB_00104034:
      fVar13 = fVar13 - fVar12;
    }
    pBVar10->angle = fVar13;
    fVar16 = fVar16 - fVar14;
    pBVar10->x = fVar16;
LAB_00104052:
    pBVar10->speed = (float)((double)pBVar10->speed + 0.01);
  }
  else if (fVar17 <= 0.0) {
    pBVar10->angle = -pBVar10->angle;
    fVar17 = fVar17 - fVar15;
    pBVar10->y = fVar17;
    goto LAB_00104052;
  }
  iVar4 = this->fieldBreakpoint;
  if (((float)iVar4 <= fVar17) && (pPVar6 = this->palette, fVar17 <= (float)(pPVar6->h + iVar4))) {
    fVar12 = (float)pPVar6->pos;
    if ((fVar12 <= fVar16) && (iVar5 = pPVar6->w, fVar16 <= (float)(pPVar6->pos + iVar5))) {
      if (this->stickyPalette == true) {
        lVar9 = 0;
        do {
          lVar11 = lVar9;
          if (lVar11 == 0x1e) goto LAB_0010415f;
          lVar9 = lVar11 + 1;
        } while (pPVar6->dockedBalls[lVar11] != (Ball *)0x0);
        pBVar10->angle = ((fVar16 - fVar12) / (float)iVar5) * 0.7 + -0.9;
        pBVar10->y = 392.0;
        pBVar10->speed = 0.0;
        pPVar6->dockedBalls[lVar11] = pBVar10;
        pBVar10 = this->ball[(uint)n];
        fVar16 = pBVar10->x;
        fVar17 = pBVar10->y;
      }
      else {
        fVar17 = (float)(iVar4 + -8);
        pBVar10->y = fVar17;
        pBVar10->angle = ((fVar16 - fVar12) / (float)iVar5) * 0.7 + -0.9;
      }
    }
  }
LAB_0010415f:
  x = (uint)(fVar16 / 24.0);
  if ((x < 0x18) && (y = (uint)(fVar17 * 0.0625), y < 0x10)) {
    cVar3 = this->block[x][y]->type;
    if (cVar3 != '\x18') {
      if (cVar3 == 'O') goto LAB_001042dd;
      deleteBlock(this,x,y);
      pBVar10 = this->ball[(uint)n];
    }
    if (x == (int)((fVar16 - fVar14) / 24.0)) {
      pBVar10->angle = -pBVar10->angle;
      pBVar10->x = pBVar10->x - fVar14;
      if (pBVar10->speed < 1.2) {
        pBVar10->speed = pBVar10->speed + 0.01;
      }
    }
    if (y == (int)((fVar17 - fVar15) * 0.0625)) {
      fVar16 = pBVar10->angle;
      if (fVar16 <= 0.0) {
        if (fVar16 < 0.0) {
          fVar17 = -1.0;
          goto LAB_00104296;
        }
        fVar17 = -fVar16;
      }
      else {
        fVar17 = 1.0;
LAB_00104296:
        fVar17 = fVar17 - fVar16;
      }
      pBVar10->angle = fVar17;
      fVar17 = pBVar10->y - fVar15;
      pBVar10->y = fVar17;
      if (pBVar10->speed < 1.2) {
        pBVar10->speed = pBVar10->speed + 0.01;
      }
    }
    else {
      fVar17 = pBVar10->y;
    }
  }
LAB_001042dd:
  if ((float)this->fieldHeight < fVar17) {
    removeBall(this,n);
  }
LAB_001042f4:
  if (this->balls < 1) {
    this->lose = true;
    this->lives = this->lives + -1;
  }
  else if (this->blockAmount < 1) {
    this->lose = true;
  }
  return;
}

Assistant:

void Map::calcBall(int n){
    if(n>=0 && n<MAX_BALLS && ball[n]){
        float dx = cos(ball[n]->angle*PI)*ball[n]->speed;
        float dy = sin(ball[n]->angle*PI)*ball[n]->speed;
        ball[n]->x += dx;
        ball[n]->y += dy;
        // Border collision
            if(ball[n]->x<=0 || ball[n]->x>=fieldWidth){
                ball[n]->angle = shiftAngleV(ball[n]->angle);
                ball[n]->x -= dx;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            } else if(ball[n]->y<=0){
                ball[n]->angle = shiftAngleH(ball[n]->angle);
                ball[n]->y -= dy;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            }
        // Palette collision
            if(ball[n]->y >= fieldBreakpoint && ball[n]->y <= fieldBreakpoint + palette->h
                    && ball[n]->x >= palette->pos && ball[n]->x <= palette->pos + palette->w){
                if(stickyPalette){
                    for(int i=0; i<MAX_BALLS; i++){
                        if(!palette->dockedBalls[i]){
                            float palx = ball[n]->x - palette->pos;
                            ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                            ball[n]->y = PALETTE_ROW*BLOCK_H - BALL_H;
                            ball[n]->speed = 0;
                            palette->dockedBalls[i] = ball[n];
                            break;
                        }
                    }

                } else{
                    ball[n]->y = fieldBreakpoint - BALL_H;
                    float palx = ball[n]->x - palette->pos;
                    ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                }
            }
        // Nearby block collision
            int bx = ball[n]->x / BLOCK_W;
            int by = ball[n]->y / BLOCK_H;
            int px = (ball[n]->x-dx) / BLOCK_W;
            int py = (ball[n]->y-dy) / BLOCK_H;
            if(bx >= 0 && bx < BLOCKS_W && by >= 0 && by < BLOCKS_H) {
                if(block[bx][by]->type != EMPTY_BLOCK_ID){
                    if(block[bx][by]->type != BLOCK_BLOCKY_ID) deleteBlock(bx, by);
                    if(bx == px){
                        ball[n]->angle = shiftAngleH(ball[n]->angle);
                        ball[n]->x -= dx;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }
                    if(by == py){
                        ball[n]->angle = shiftAngleV(ball[n]->angle);
                        ball[n]->y -= dy;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }

                }

            }

        // Fly through breakpoint
            if(ball[n]->y > fieldHeight){
                //ball[n]->angle = shiftAngleH(ball[n]->angle);
                removeBall(n);
            }
    }
    if(balls<=0) {
        lose = true;
        lives--;
    } else if(blockAmount <= 0){
        lose = true;
    }
}